

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Fillet3.cpp
# Opt level: O1

void __thiscall
chrono::ChFunction_Fillet3::ArchiveIN(ChFunction_Fillet3 *this,ChArchiveIn *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Fillet3>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_30 = &this->end;
  local_38 = "end";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->y1;
  local_38 = "y1";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->y2;
  local_38 = "y2";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->dy1;
  local_38 = "dy1";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->dy2;
  local_38 = "dy2";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  SetupCoefficients(this);
  return;
}

Assistant:

void ChFunction_Fillet3::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Fillet3>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(end);
    marchive >> CHNVP(y1);
    marchive >> CHNVP(y2);
    marchive >> CHNVP(dy1);
    marchive >> CHNVP(dy2);
    SetupCoefficients();
}